

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_ChangeCamera(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  int *piVar1;
  player_t *ppVar2;
  long lVar3;
  AActor *pAVar4;
  long lVar5;
  AActor *pAVar6;
  int i;
  long lVar7;
  long *plVar8;
  
  if (arg0 == 0) {
    pAVar6 = (AActor *)0x0;
  }
  else {
    for (pAVar6 = AActor::TIDHash[arg0 & 0x7f]; (pAVar6 != (AActor *)0x0 && (pAVar6->tid != arg0));
        pAVar6 = pAVar6->inext) {
    }
  }
  if ((it == (AActor *)0x0) || (ppVar2 = it->player, arg1 != 0 || ppVar2 == (player_t *)0x0)) {
    plVar8 = &DAT_017e5fc8;
    lVar7 = 0;
    do {
      if (playeringame[lVar7] == true) {
        lVar3 = *plVar8;
        if ((lVar3 != 0) && ((*(byte *)(lVar3 + 0x20) & 0x20) != 0)) {
          *plVar8 = 0;
          lVar3 = 0;
        }
        if (pAVar6 == (AActor *)0x0) {
          *plVar8 = plVar8[-0x2f];
          *(byte *)(plVar8 + -0x12) = *(byte *)(plVar8 + -0x12) & 0x7f;
        }
        else {
          *plVar8 = (long)pAVar6;
          if (arg2 != 0) {
            *(byte *)(plVar8 + -0x12) = *(byte *)(plVar8 + -0x12) | 0x80;
          }
        }
        lVar5 = *plVar8;
        if ((lVar5 != 0) && ((*(byte *)(lVar5 + 0x20) & 0x20) != 0)) {
          *plVar8 = 0;
          lVar5 = 0;
        }
        if (lVar3 != lVar5) {
          pAVar4 = (AActor *)*plVar8;
          if ((pAVar4 != (AActor *)0x0) &&
             (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            *plVar8 = 0;
            pAVar4 = (AActor *)0x0;
          }
          R_ClearPastViewer(pAVar4);
        }
      }
      lVar7 = lVar7 + 1;
      plVar8 = plVar8 + 0x54;
    } while (lVar7 != 8);
  }
  else {
    pAVar4 = (ppVar2->camera).field_0.p;
    if ((pAVar4 != (AActor *)0x0) &&
       (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (ppVar2->camera).field_0.p = (AActor *)0x0;
      pAVar4 = (AActor *)0x0;
    }
    if (pAVar6 == (AActor *)0x0) {
      (it->player->camera).field_0.p = it;
      piVar1 = &it->player->cheats;
      *piVar1 = *piVar1 & 0xffffff7f;
    }
    else {
      (it->player->camera).field_0.p = pAVar6;
      if (arg2 != 0) {
        piVar1 = &it->player->cheats;
        *piVar1 = *piVar1 | 0x80;
      }
    }
    pAVar6 = (it->player->camera).field_0.p;
    if ((pAVar6 != (AActor *)0x0) &&
       (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (it->player->camera).field_0.p = (AActor *)0x0;
      pAVar6 = (AActor *)0x0;
    }
    if (pAVar4 != pAVar6) {
      pAVar6 = (it->player->camera).field_0.p;
      if ((pAVar6 != (AActor *)0x0) &&
         (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (it->player->camera).field_0.p = (AActor *)0x0;
        pAVar6 = (AActor *)0x0;
      }
      R_ClearPastViewer(pAVar6);
    }
  }
  return 1;
}

Assistant:

FUNC(LS_ChangeCamera)
// ChangeCamera (tid, who, revert?)
{
	AActor *camera;
	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);
		camera = iterator.Next ();
	}
	else
	{
		camera = NULL;
	}

	if (!it || !it->player || arg1)
	{
		int i;

		for (i = 0; i < MAXPLAYERS; i++)
		{
			if (!playeringame[i])
				continue;

			AActor *oldcamera = players[i].camera;
			if (camera)
			{
				players[i].camera = camera;
				if (arg2)
					players[i].cheats |= CF_REVERTPLEASE;
			}
			else
			{
				players[i].camera = players[i].mo;
				players[i].cheats &= ~CF_REVERTPLEASE;
			}
			if (oldcamera != players[i].camera)
			{
				R_ClearPastViewer (players[i].camera);
			}
		}
	}
	else
	{
		AActor *oldcamera = it->player->camera;
		if (camera)
		{
			it->player->camera = camera;
			if (arg2)
				it->player->cheats |= CF_REVERTPLEASE;
		}
		else
		{
			it->player->camera = it;
			it->player->cheats &= ~CF_REVERTPLEASE;
		}
		if (oldcamera != it->player->camera)
		{
			R_ClearPastViewer (it->player->camera);
		}
	}

	return true;
}